

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thrift_tools.hpp
# Opt level: O3

void __thiscall duckdb::ReadAheadBuffer::Prefetch(ReadAheadBuffer *this)

{
  ReadAheadBuffer *pRVar1;
  size_t sVar2;
  long lVar3;
  idx_t iVar4;
  runtime_error *this_00;
  BufferHandle BStack_38;
  
  pRVar1 = (ReadAheadBuffer *)
           (this->read_heads).super__List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  while( true ) {
    if (pRVar1 == this) {
      return;
    }
    sVar2 = (pRVar1->read_heads).
            super__List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>._M_impl._M_node.
            _M_size;
    lVar3 = *(long *)&(pRVar1->merge_set)._M_t._M_impl;
    iVar4 = CachingFileHandle::GetFileSize(this->file_handle);
    if (iVar4 < sVar2 + lVar3) break;
    CachingFileHandle::Read
              (&BStack_38,this->file_handle,
               (data_ptr_t *)
               &(pRVar1->merge_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
               *(idx_t *)&(pRVar1->merge_set)._M_t._M_impl,
               (pRVar1->read_heads).
               super__List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>._M_impl._M_node
               ._M_size);
    BufferHandle::operator=
              ((BufferHandle *)&(pRVar1->merge_set)._M_t._M_impl.super__Rb_tree_header,&BStack_38);
    BufferHandle::~BufferHandle(&BStack_38);
    *(undefined1 *)&(pRVar1->merge_set)._M_t._M_impl.super__Rb_tree_header._M_node_count = 1;
    pRVar1 = (ReadAheadBuffer *)
             (pRVar1->read_heads).
             super__List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>._M_impl._M_node.
             super__List_node_base._M_next;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error
            (this_00,"Prefetch registered requested for bytes outside file");
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Prefetch() {
		for (auto &read_head : read_heads) {
			if (read_head.GetEnd() > file_handle.GetFileSize()) {
				throw std::runtime_error("Prefetch registered requested for bytes outside file");
			}
			read_head.buffer_handle = file_handle.Read(read_head.buffer_ptr, read_head.size, read_head.location);
			read_head.data_isset = true;
		}
	}